

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

int __thiscall gl3cts::CommonBugsTests::init(CommonBugsTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  GetProgramivActiveUniformBlockMaxNameLengthTest *this_00;
  InputVariablesCannotBeModifiedTest *this_01;
  InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *this_02;
  InvalidVSInputsTest *this_03;
  ParenthesisInLayoutQualifierIntegerValuesTest *this_04;
  PerVertexValidationTest *this_05;
  ReservedNamesTest *this_06;
  SparseBuffersWithCopyOpsTest *this_07;
  
  this_00 = (GetProgramivActiveUniformBlockMaxNameLengthTest *)operator_new(0x88);
  GetProgramivActiveUniformBlockMaxNameLengthTest::GetProgramivActiveUniformBlockMaxNameLengthTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (InputVariablesCannotBeModifiedTest *)operator_new(0x90);
  InputVariablesCannotBeModifiedTest::InputVariablesCannotBeModifiedTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *)operator_new(0x80);
  InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::InvalidUseCasesForAllNotFuncsAndExclMarkOpTest
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (InvalidVSInputsTest *)operator_new(0x80);
  InvalidVSInputsTest::InvalidVSInputsTest(this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (ParenthesisInLayoutQualifierIntegerValuesTest *)operator_new(0x80);
  ParenthesisInLayoutQualifierIntegerValuesTest::ParenthesisInLayoutQualifierIntegerValuesTest
            (this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (PerVertexValidationTest *)operator_new(0xa8);
  PerVertexValidationTest::PerVertexValidationTest(this_05,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (ReservedNamesTest *)operator_new(0xb8);
  ReservedNamesTest::ReservedNamesTest(this_06,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (SparseBuffersWithCopyOpsTest *)operator_new(0xb0);
  SparseBuffersWithCopyOpsTest::SparseBuffersWithCopyOpsTest
            (this_07,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  return extraout_EAX;
}

Assistant:

void CommonBugsTests::init()
{
	addChild(new GetProgramivActiveUniformBlockMaxNameLengthTest(m_context));
	addChild(new InputVariablesCannotBeModifiedTest(m_context));
	addChild(new InvalidUseCasesForAllNotFuncsAndExclMarkOpTest(m_context));
	addChild(new InvalidVSInputsTest(m_context));
	addChild(new ParenthesisInLayoutQualifierIntegerValuesTest(m_context));
	addChild(new PerVertexValidationTest(m_context));
	addChild(new ReservedNamesTest(m_context));
	addChild(new SparseBuffersWithCopyOpsTest(m_context));
}